

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O1

void __thiscall Console::Console(Console *this)

{
  anon_class_1_0_00000001 local_11;
  
  (this->super_actor).context_.object_ = (object_t *)0x0;
  (this->super_actor).self_.object_ = (object_t *)0x0;
  (this->super_actor).handlers_._M_h._M_buckets =
       &(this->super_actor).handlers_._M_h._M_single_bucket;
  (this->super_actor).handlers_._M_h._M_bucket_count = 1;
  (this->super_actor).handlers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_actor).handlers_._M_h._M_element_count = 0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_actor).handlers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_actor).terminating_ = false;
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__actor_0010e750;
  acto::actor::handler<msg_out,Console::Console()::_lambda(acto::actor_ref,msg_out_const&)_1_,void>
            (&this->super_actor,&local_11);
  return;
}

Assistant:

Console() {
    // Метод handler связывает конкретную процедуру с библиотекой
    // для обработки сообщения указанного типа.
    handler< msg_out >( [] (acto::actor_ref, const msg_out& msg)
      { std::cout << msg.text << std::endl; }
    );


    // Во время работы программы можно сменить обработчик просто указав другой метод.
    // Ex:
    //    handler< msg_out >( &Console::another_proc );
    //
    //    handler< msg_out >( [] (acto::actor_ref& sender, const msg_out& msg)
    //        { ; }
    //    );
    // Для того, чтобы отключить обработку указанного сообщения необходимо вызвать
    // метод handler без параметров.
    // Ex:
    //    handler< msg_out >();
    //
    // Метод handler является защищенным методом класса act_o::actor.
    // Это означает, что его невозможно использовать во вне класса-актера.
    // Также это означает, что handler устанавливает обработчики только
    // для объектов данного класса и никакого другого.
  }